

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O1

vector<Pathie::Path,_std::allocator<Pathie::Path>_> * __thiscall
Pathie::Path::burst(vector<Pathie::Path,_std::allocator<Pathie::Path>_> *__return_storage_ptr__,
                   Path *this,bool descend)

{
  long lVar1;
  ulong uVar2;
  string lastcomponent;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  Path local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = 0;
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Pathie::Path,_std::allocator<Pathie::Path>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  if (*(this->m_path)._M_dataplus._M_p == '/') {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"/","");
    Path((Path *)&local_130,&local_70);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
              (__return_storage_ptr__,(value_type *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    uVar2 = 1;
    std::__cxx11::string::append((char *)&local_f0);
  }
  while (lVar1 = std::__cxx11::string::find((char *)this,0x10f1b8,uVar2), lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_130,(ulong)this);
    if (descend) {
      std::operator+(&local_90,&local_f0,&local_130);
      Path(&local_110,&local_90);
      std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
                (__return_storage_ptr__,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.m_path._M_dataplus._M_p != &local_110.m_path.field_2) {
        operator_delete(local_110.m_path._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_130._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&local_f0);
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_130._M_dataplus._M_p,
                 local_130._M_dataplus._M_p + local_130._M_string_length);
      Path(&local_110,&local_d0);
      std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
                (__return_storage_ptr__,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110.m_path._M_dataplus._M_p != &local_110.m_path.field_2) {
        operator_delete(local_110.m_path._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    uVar2 = lVar1 + 1;
  }
  std::__cxx11::string::substr((ulong)&local_130,(ulong)this);
  if (descend) {
    std::operator+(&local_50,&local_f0,&local_130);
    Path(&local_110,&local_50);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
              (__return_storage_ptr__,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.m_path._M_dataplus._M_p != &local_110.m_path.field_2) {
      operator_delete(local_110.m_path._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00109406;
  }
  else {
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_130._M_dataplus._M_p,
               local_130._M_dataplus._M_p + local_130._M_string_length);
    Path(&local_110,&local_b0);
    std::vector<Pathie::Path,_std::allocator<Pathie::Path>_>::push_back
              (__return_storage_ptr__,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.m_path._M_dataplus._M_p != &local_110.m_path.field_2) {
      operator_delete(local_110.m_path._M_dataplus._M_p);
    }
    local_50._M_dataplus._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_00109406;
  }
  operator_delete(local_50._M_dataplus._M_p);
LAB_00109406:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Path> Path::burst(bool descend /* = false */) const
{
  size_t pos = 0;
  size_t lastpos = 0;
  std::vector<Path> results;
  std::string prefix;

  // Take care of leading / of absolute paths
  if (m_path[0] == '/') {
    results.push_back(Path("/"));
    prefix.append("/");

    // Adjust pos so we don’t find the initial /
    pos++;
    lastpos++;
  }

  while((pos = m_path.find("/", pos)) != string::npos) {
    std::string component = m_path.substr(lastpos, pos - lastpos);

    if (descend) {
      results.push_back(Path(prefix + component));
      prefix.append(component);
      prefix.append("/");
    }
    else {
      results.push_back(Path(component));
    }

    lastpos = pos + 1;
    pos++;
  }

  std::string lastcomponent = m_path.substr(lastpos);

  if (descend)
    results.push_back(Path(prefix + lastcomponent)); // Note no trailing /
  else
    results.push_back(Path(lastcomponent));

  return results;
}